

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# am_value.cpp
# Opt level: O0

bool __thiscall Am_Value::operator!=(Am_Value *this,Am_String *test_value)

{
  Am_String_Data *this_00;
  bool bVar1;
  uint uVar2;
  char *pcVar3;
  bool local_39;
  Am_String *test_value_local;
  Am_Value *this_local;
  
  uVar2 = (uint)this->type;
  if ((uVar2 - 2 < 2) || (uVar2 == 9)) {
    local_39 = true;
    if ((this->value).wrapper_value == (Am_Wrapper *)0x0) {
      pcVar3 = Am_String::operator_cast_to_char_(test_value);
      local_39 = pcVar3 != (char *)0x0;
    }
    this_local._7_1_ = local_39;
  }
  else if (uVar2 == 0x8008) {
    this_00 = (Am_String_Data *)(this->value).wrapper_value;
    pcVar3 = Am_String::operator_cast_to_char_(test_value);
    bVar1 = Am_String_Data::operator==(this_00,pcVar3);
    this_local._7_1_ = (bool)((bVar1 ^ 0xffU) & 1);
  }
  else {
    this_local._7_1_ = true;
  }
  return this_local._7_1_;
}

Assistant:

bool
Am_Value::operator!=(const Am_String &test_value) const
{
  switch (type) {
  case Am_STRING:
    return !(*(Am_String_Data *)value.wrapper_value == test_value);
  case Am_INT:
  case Am_LONG:
  case Am_VOIDPTR:
    return value.voidptr_value || (const char *)test_value;
  default:
    return true;
  }
}